

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_level_visuals.cxx
# Opt level: O1

void __thiscall
xray_re::xr_level_visuals::load_ogfs(xr_level_visuals *this,xr_reader *r,xr_level_geom *geom)

{
  uint8_t uVar1;
  uint8_t *puVar2;
  size_t sVar3;
  xr_ogf_v4 *this_00;
  uint32_t id;
  xr_reader *local_48;
  xr_ogf_v4 *local_40;
  xr_swibuf_vec *local_38;
  
  local_48 = xr_reader::open_chunk(r,0);
  if (local_48 != (xr_reader *)0x0) {
    local_38 = &geom->m_swibufs;
    id = 1;
    do {
      sVar3 = xr_reader::find_chunk(local_48,1);
      if (sVar3 == 0) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_visuals.cxx"
                      ,0x35,
                      "void xray_re::xr_level_visuals::load_ogfs(xr_reader &, const xr_level_geom *)"
                     );
      }
      puVar2 = (local_48->field_2).m_p;
      (local_48->field_2).m_p = puVar2 + 1;
      uVar1 = *puVar2;
      if (uVar1 == '\x04') {
        this_00 = (xr_ogf_v4 *)operator_new(0x7b8);
        xr_ogf_v4::xr_ogf_v4(this_00);
        (*(this_00->super_xr_ogf).super_xr_object.super_xr_surface_factory._vptr_xr_surface_factory
          [0x15])(this_00,local_48);
        xr_ogf_v4::set_ext_geom(this_00,&geom->m_vbufs,&geom->m_ibufs,local_38);
      }
      else {
        if (uVar1 != '\x03') {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_level_visuals.cxx"
                        ,0x45,
                        "void xray_re::xr_level_visuals::load_ogfs(xr_reader &, const xr_level_geom *)"
                       );
        }
        this_00 = (xr_ogf_v4 *)operator_new(0x770);
        xr_ogf_v3::xr_ogf_v3((xr_ogf_v3 *)this_00);
        (*(this_00->super_xr_ogf).super_xr_object.super_xr_surface_factory._vptr_xr_surface_factory
          [0x15])(this_00,local_48);
        xr_ogf_v3::set_ext_geom((xr_ogf_v3 *)this_00,&geom->m_vbufs,&geom->m_ibufs);
      }
      local_40 = this_00;
      std::vector<xray_re::xr_ogf*,std::allocator<xray_re::xr_ogf*>>::emplace_back<xray_re::xr_ogf*>
                ((vector<xray_re::xr_ogf*,std::allocator<xray_re::xr_ogf*>> *)&this->m_ogfs,
                 (xr_ogf **)&local_40);
      xr_reader::close_chunk(r,&local_48);
      local_48 = xr_reader::open_chunk(r,id);
      id = id + 1;
    } while (local_48 != (xr_reader *)0x0);
  }
  return;
}

Assistant:

void xr_level_visuals::load_ogfs(xr_reader& r, const xr_level_geom* geom)
{
	xr_reader* s;
	for (uint32_t id = 0; (s = r.open_chunk(id)); ++id) {
		if (!s->find_chunk(OGF_HEADER))
			xr_not_expected();
		ogf_version version = static_cast<ogf_version>(s->r_u8());
		switch (version) {
			case 3: {
				xr_ogf_v3 * ogf = new xr_ogf_v3;
				ogf->load_ogf(*s);
				ogf->set_ext_geom(geom->vbufs(), geom->ibufs());
				m_ogfs.push_back(ogf);
				} break;
			case 4: {
				xr_ogf_v4 * ogf = new xr_ogf_v4;
				ogf->load_ogf(*s);
				ogf->set_ext_geom(geom->vbufs(), geom->ibufs(), geom->swibufs());
				m_ogfs.push_back(ogf);
				} break;
			default:
				xr_not_expected();
		}
		r.close_chunk(s);
	}
}